

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

deUint32 *
vk::BinaryRegistryDetail::BinaryIndexHashImpl_find(BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  deUint32 dVar1;
  deBool dVar2;
  int local_34;
  BinaryIndexHashImplSlot *pBStack_30;
  int elemNdx;
  BinaryIndexHashImplSlot *slot;
  int slotNdx;
  ProgramBinary *key_local;
  BinaryIndexHashImpl *hash_local;
  
  if (0 < hash->numElements) {
    dVar1 = anon_unknown_8::binaryHash(key);
    for (pBStack_30 = hash->slotTable[(int)(dVar1 & hash->slotTableSize - 1U)];
        pBStack_30 != (BinaryIndexHashImplSlot *)0x0; pBStack_30 = pBStack_30->nextSlot) {
      for (local_34 = 0; local_34 < pBStack_30->numUsed; local_34 = local_34 + 1) {
        dVar2 = anon_unknown_8::binaryEqual(pBStack_30->keys[local_34],key);
        if (dVar2 != 0) {
          return pBStack_30->values + local_34;
        }
      }
    }
  }
  return (deUint32 *)0x0;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}